

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_textedit_locate_coord(nk_text_edit *edit,float x,float y,nk_user_font *font,float row_height)

{
  float line_start;
  nk_rune nVar1;
  float fVar2;
  float w;
  int k;
  int i;
  float prev_x;
  float base_y;
  int n;
  nk_text_edit_row r;
  float row_height_local;
  nk_user_font *font_local;
  float y_local;
  float x_local;
  nk_text_edit *edit_local;
  
  edit_local._4_4_ = (float)(edit->string).len;
  i = 0;
  n = 0;
  base_y = 0.0;
  r.baseline_y_delta = 0.0;
  r.x1 = 0.0;
  r.ymin = 0.0;
  r.ymax = row_height;
  unique0x100000a2 = font;
  for (w = 0.0; line_start = w, (int)w < (int)edit_local._4_4_; w = (float)((int)r.ymin + (int)w)) {
    nk_textedit_layout_row((nk_text_edit_row *)&base_y,edit,(int)w,r.ymax,stack0xffffffffffffffd8);
    if ((int)r.ymin < 1) {
      return (int)edit_local._4_4_;
    }
    if ((w == 0.0) && (y < (float)i + r.x1)) {
      return 0;
    }
    if (y < (float)i + r.baseline_y_delta) break;
    i = (int)(r.x0 + (float)i);
  }
  if ((int)w < (int)edit_local._4_4_) {
    if (base_y <= x) {
      if (x < (float)n) {
        k = (int)base_y;
        for (w = 0.0; (int)w < (int)r.ymin; w = (float)((int)w + 1)) {
          fVar2 = nk_textedit_get_width(edit,(int)line_start,(int)w,stack0xffffffffffffffd8);
          if (x < (float)k + fVar2) {
            if (x < (float)k + fVar2 / 2.0) {
              return (int)line_start + (int)w;
            }
            return (int)line_start + (int)w + 1;
          }
          k = (int)(fVar2 + (float)k);
        }
      }
      nVar1 = nk_str_rune_at(&edit->string,(int)w + (int)r.ymin + -1);
      if (nVar1 == 10) {
        edit_local._4_4_ = (float)((int)w + (int)r.ymin + -1);
      }
      else {
        edit_local._4_4_ = (float)((int)w + (int)r.ymin);
      }
    }
    else {
      edit_local._4_4_ = w;
    }
  }
  return (int)edit_local._4_4_;
}

Assistant:

NK_INTERN int
nk_textedit_locate_coord(struct nk_text_edit *edit, float x, float y,
    const struct nk_user_font *font, float row_height)
{
    struct nk_text_edit_row r;
    int n = edit->string.len;
    float base_y = 0, prev_x;
    int i=0, k;

    r.x0 = r.x1 = 0;
    r.ymin = r.ymax = 0;
    r.num_chars = 0;

    /* search rows to find one that straddles 'y' */
    while (i < n) {
        nk_textedit_layout_row(&r, edit, i, row_height, font);
        if (r.num_chars <= 0)
            return n;

        if (i==0 && y < base_y + r.ymin)
            return 0;

        if (y < base_y + r.ymax)
            break;

        i += r.num_chars;
        base_y += r.baseline_y_delta;
    }

    /* below all text, return 'after' last character */
    if (i >= n)
        return n;

    /* check if it's before the beginning of the line */
    if (x < r.x0)
        return i;

    /* check if it's before the end of the line */
    if (x < r.x1) {
        /* search characters in row for one that straddles 'x' */
        k = i;
        prev_x = r.x0;
        for (i=0; i < r.num_chars; ++i) {
            float w = nk_textedit_get_width(edit, k, i, font);
            if (x < prev_x+w) {
                if (x < prev_x+w/2)
                    return k+i;
                else return k+i+1;
            }
            prev_x += w;
        }
        /* shouldn't happen, but if it does, fall through to end-of-line case */
    }

    /* if the last character is a newline, return that.
     * otherwise return 'after' the last character */
    if (nk_str_rune_at(&edit->string, i+r.num_chars-1) == '\n')
        return i+r.num_chars-1;
    else return i+r.num_chars;
}